

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient2d(double *pa,double *pb,double *pc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined4 extraout_EAX;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dStack_240;
  double dStack_200;
  double dStack_1e0;
  double dStack_1c0;
  double dStack_188;
  double dStack_180;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double adStack_150 [17];
  double adStack_c8 [8];
  double adStack_88 [13];
  
  dVar9 = splitter;
  dVar14 = (pb[1] - pc[1]) * (*pa - *pc);
  dVar15 = (*pb - *pc) * (pa[1] - pc[1]);
  dVar12 = dVar14 - dVar15;
  if (dVar14 <= 0.0) {
    if (0.0 <= dVar14) {
      return dVar12;
    }
    if (0.0 <= dVar15) {
      return dVar12;
    }
    dVar14 = -dVar14 - dVar15;
  }
  else {
    if (dVar15 <= 0.0) {
      return dVar12;
    }
    dVar14 = dVar14 + dVar15;
  }
  if ((dVar12 < ccwerrboundA * dVar14) && (-dVar12 < ccwerrboundA * dVar14)) {
    dVar5 = *pa;
    dVar8 = pa[1];
    auVar1 = *(undefined1 (*) [16])pc;
    dVar15 = auVar1._0_8_;
    dVar29 = dVar5 - dVar15;
    dVar23 = auVar1._8_8_;
    dVar25 = dVar8 - dVar23;
    dVar13 = *pb;
    dVar33 = pb[1];
    auVar2._8_4_ = auVar1._0_4_;
    auVar2._0_8_ = dVar23;
    auVar2._12_4_ = auVar1._4_4_;
    dVar24 = dVar33 - dVar23;
    dVar26 = dVar13 - dVar15;
    dVar31 = splitter * dVar24 - (splitter * dVar24 - dVar24);
    dVar32 = splitter * dVar26 - (splitter * dVar26 - dVar26);
    dVar28 = dVar24 - dVar31;
    dVar30 = dVar26 - dVar32;
    auVar1._8_4_ = SUB84(splitter,0);
    auVar1._0_8_ = splitter;
    auVar1._12_4_ = (int)((ulong)splitter >> 0x20);
    dVar20 = dVar29 * splitter - (dVar29 * splitter - dVar29);
    dVar22 = dVar25 * splitter - (dVar25 * splitter - dVar25);
    dVar16 = dVar29 - dVar20;
    dVar18 = dVar25 - dVar22;
    auVar6._8_4_ = SUB84(dVar25,0);
    auVar6._0_8_ = dVar29;
    auVar6._12_4_ = (int)((ulong)dVar25 >> 0x20);
    dVar12 = dVar24 * dVar29;
    dVar25 = dVar26 * dVar25;
    dVar17 = dVar16 * dVar28 - (((dVar12 - dVar20 * dVar31) - dVar16 * dVar31) - dVar20 * dVar28);
    dVar19 = dVar18 * dVar30 - (((dVar25 - dVar22 * dVar32) - dVar18 * dVar32) - dVar22 * dVar30);
    dVar21 = dVar17 - dVar19;
    dVar11 = dVar12 + dVar21;
    dVar12 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar21 - (dVar11 - dVar12));
    dVar27 = dVar12 - dVar25;
    dStack_188 = (dVar17 - (dVar21 + (dVar17 - dVar21))) + ((dVar17 - dVar21) - dVar19);
    dStack_180 = (dVar12 - (dVar27 + (dVar12 - dVar27))) + ((dVar12 - dVar27) - dVar25);
    dStack_170 = dVar11 + dVar27;
    dStack_178 = (dVar11 - (dStack_170 - (dStack_170 - dVar11))) + (dVar27 - (dStack_170 - dVar11));
    dVar12 = estimate(4,&dStack_188);
    if ((dVar12 < ccwerrboundB * dVar14) && (-dVar12 < ccwerrboundB * dVar14)) {
      dStack_1e0 = auVar6._8_8_;
      dVar25 = (dVar5 - (dVar29 + (dVar5 - dVar29))) + ((dVar5 - dVar29) - dVar15);
      dVar27 = (dVar8 - (dStack_1e0 + (dVar8 - dStack_1e0))) + ((dVar8 - dStack_1e0) - dVar23);
      dStack_200 = auVar2._8_8_;
      dVar15 = (dVar33 - (dVar24 + (dVar33 - dVar24))) + ((dVar33 - dVar24) - dVar23);
      dVar23 = (dVar13 - (dVar26 + (dVar13 - dVar26))) + ((dVar13 - dVar26) - dStack_200);
      auVar3._4_4_ = -(uint)(dVar27 != 0.0);
      auVar3._0_4_ = -(uint)(dVar25 != 0.0);
      auVar3._8_4_ = -(uint)(dVar15 != 0.0);
      auVar3._12_4_ = -(uint)(dVar23 != 0.0);
      iVar10 = movmskps(extraout_EAX,auVar3);
      if (iVar10 != 0) {
        dVar14 = dVar14 * ccwerrboundC + ABS(dVar12) * resulterrbound;
        dVar24 = dVar24 * dVar25;
        dVar26 = dVar26 * dVar27;
        dVar29 = dVar29 * dVar15;
        dStack_1e0 = dStack_1e0 * dVar23;
        dVar12 = dVar12 + ((dVar29 + dVar24) - (dStack_1e0 + dVar26));
        if ((dVar12 < dVar14) && (-dVar12 < dVar14)) {
          dStack_240 = auVar1._8_8_;
          dVar12 = dVar9 * dVar25;
          dVar12 = dVar12 - (dVar12 - dVar25);
          dVar14 = dStack_240 * dVar27 - (dStack_240 * dVar27 - dVar27);
          dVar11 = dVar25 - dVar12;
          dVar19 = dVar27 - dVar14;
          auVar4._8_4_ = SUB84(dVar14,0);
          auVar4._0_8_ = dVar12;
          auVar4._12_4_ = (int)((ulong)dVar14 >> 0x20);
          dVar33 = dVar28 * dVar11 -
                   (((dVar24 - dVar12 * dVar31) - dVar31 * dVar11) - dVar12 * dVar28);
          dVar17 = dVar30 * dVar19 -
                   (((dVar26 - dVar14 * dVar32) - dVar32 * dVar19) - dVar14 * dVar30);
          dVar8 = dVar33 - dVar17;
          dVar13 = dVar24 + dVar8;
          dVar14 = (dVar24 - (dVar13 - (dVar13 - dVar24))) + (dVar8 - (dVar13 - dVar24));
          dVar5 = dVar14 - dVar26;
          dStack_168 = (dVar33 - (dVar8 + (dVar33 - dVar8))) + ((dVar33 - dVar8) - dVar17);
          dStack_160 = (dVar14 - (dVar5 + (dVar14 - dVar5))) + ((dVar14 - dVar5) - dVar26);
          adStack_150[0] = dVar13 + dVar5;
          dStack_158 = (dVar13 - (adStack_150[0] - (adStack_150[0] - dVar13))) +
                       (dVar5 - (adStack_150[0] - dVar13));
          iVar10 = fast_expansion_sum_zeroelim(4,&dStack_188,4,&dStack_168,adStack_c8);
          dVar9 = dVar9 * dVar15;
          dVar9 = dVar9 - (dVar9 - dVar15);
          dVar5 = dStack_240 * dVar23 - (dStack_240 * dVar23 - dVar23);
          auVar7._8_4_ = SUB84(dVar5,0);
          auVar7._0_8_ = dVar9;
          auVar7._12_4_ = (int)((ulong)dVar5 >> 0x20);
          dVar17 = dVar15 - dVar9;
          dVar21 = dVar23 - dVar5;
          dVar14 = dVar16 * dVar17 - (-dVar20 * dVar17 + -dVar16 * dVar9 + -dVar20 * dVar9 + dVar29)
          ;
          dVar8 = dVar18 * dVar21 -
                  (-dVar22 * dVar21 + -dVar18 * dVar5 + -dVar22 * dVar5 + dStack_1e0);
          dVar13 = dVar14 - dVar8;
          dVar33 = dVar29 + dVar13;
          dVar29 = (dVar29 - (dVar33 - (dVar33 - dVar29))) + (dVar13 - (dVar33 - dVar29));
          dVar5 = dVar29 - dStack_1e0;
          dStack_168 = (dVar14 - (dVar13 + (dVar14 - dVar13))) + ((dVar14 - dVar13) - dVar8);
          dStack_160 = (dVar29 - (dVar5 + (dVar29 - dVar5))) + ((dVar29 - dVar5) - dStack_1e0);
          adStack_150[0] = dVar33 + dVar5;
          dStack_158 = (dVar33 - (adStack_150[0] - (adStack_150[0] - dVar33))) +
                       (dVar5 - (adStack_150[0] - dVar33));
          iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_c8,4,&dStack_168,adStack_88);
          dVar15 = dVar15 * dVar25;
          dVar23 = dVar23 * dVar27;
          dStack_1c0 = auVar4._8_8_;
          dStack_240 = auVar7._8_8_;
          dVar29 = dVar17 * dVar11 -
                   (((dVar15 - dVar12 * dVar9) - dVar9 * dVar11) - dVar12 * dVar17);
          dVar27 = dVar21 * dVar19 -
                   (((dVar23 - dStack_1c0 * dStack_240) - dStack_240 * dVar19) - dStack_1c0 * dVar21
                   );
          dVar14 = dVar29 - dVar27;
          dVar25 = dVar15 + dVar14;
          dVar12 = (dVar15 - (dVar25 - (dVar25 - dVar15))) + (dVar14 - (dVar25 - dVar15));
          dVar9 = dVar12 - dVar23;
          dStack_168 = (dVar29 - (dVar14 + (dVar29 - dVar14))) + ((dVar29 - dVar14) - dVar27);
          dStack_160 = (dVar12 - (dVar9 + (dVar12 - dVar9))) + ((dVar12 - dVar9) - dVar23);
          adStack_150[0] = dVar25 + dVar9;
          dStack_158 = (dVar25 - (adStack_150[0] - (adStack_150[0] - dVar25))) +
                       (dVar9 - (adStack_150[0] - dVar25));
          iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_88,4,&dStack_168,adStack_150 + 1);
          dVar12 = adStack_150[iVar10];
        }
      }
    }
    return dVar12;
  }
  return dVar12;
}

Assistant:

REAL orient2d(REAL *pa, REAL *pb, REAL *pc)
{
  REAL detleft, detright, det;
  REAL detsum, errbound;

  detleft = (pa[0] - pc[0]) * (pb[1] - pc[1]);
  detright = (pa[1] - pc[1]) * (pb[0] - pc[0]);
  det = detleft - detright;

  if (detleft > 0.0) {
    if (detright <= 0.0) {
      return det;
    } else {
      detsum = detleft + detright;
    }
  } else if (detleft < 0.0) {
    if (detright >= 0.0) {
      return det;
    } else {
      detsum = -detleft - detright;
    }
  } else {
    return det;
  }

  errbound = ccwerrboundA * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient2dadapt(pa, pb, pc, detsum);
}